

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::evaluateFileInto
          (QMakeEvaluator *this,QString *fileName,ProValueMap *values,LoadFlags flags)

{
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar1;
  bool bVar2;
  VisitReturn VVar3;
  QList<ProString> *this_00;
  ProString *ifn;
  ProString *str;
  long lVar4;
  long in_FS_OFFSET;
  ProKey qiif;
  QMakeEvaluator visitor;
  QArrayDataPointer<ProString> local_358;
  QArrayDataPointer<ProString> local_338;
  undefined1 local_318 [32];
  undefined1 *local_2f8;
  undefined1 *puStack_2f0;
  QMakeEvaluator local_2e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_2e8,0xaa,0x2b0);
  QMakeEvaluator(&local_2e8,this->m_option,this->m_parser,this->m_vfs,this->m_handler);
  local_2e8.m_caller = this;
  QString::operator=(&local_2e8.m_outputDir,(QString *)&this->m_outputDir);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::reset
            (&local_2e8.m_featureRoots,(this->m_featureRoots).d.ptr);
  VVar3 = evaluateFileChecked(&local_2e8,fileName,EvalAuxFile,flags);
  if (VVar3 == ReturnTrue) {
    pQVar1 = (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
              *)local_2e8.m_valuemapStack.
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    if (pQVar1 != (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                   *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
    local_318._0_8_ = (values->d).d.ptr;
    (values->d).d.ptr = pQVar1;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                *)local_318);
    local_2f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_2f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_318._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_318._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_318._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_318._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_318,"QMAKE_INTERNAL_INCLUDED_FILES");
    this_00 = &QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)
                          ((this->m_valuemapStack).
                           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           .
                           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next + 1),(ProKey *)local_318)
               ->super_QList<ProString>;
    local_338.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_338.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_338.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    local_358.d = (Data *)0x0;
    local_358.ptr = (ProString *)0x0;
    local_358.size = 0;
    QMap<ProKey,_ProStringList>::value
              ((ProStringList *)&local_338,values,(ProKey *)local_318,(ProStringList *)&local_358);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_358);
    if ((undefined1 *)local_338.size != (undefined1 *)0x0) {
      lVar4 = local_338.size * 0x30;
      str = local_338.ptr;
      do {
        bVar2 = ProStringList::contains((ProStringList *)this_00,str,CaseSensitive);
        if (!bVar2) {
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,str);
          QList<ProString>::end(this_00);
        }
        str = str + 1;
        lVar4 = lVar4 + -0x30;
      } while (lVar4 != 0);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_338);
    if ((QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)local_318._0_8_ !=
        (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)0x0) {
      LOCK();
      *(int *)local_318._0_8_ = *(int *)local_318._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_318._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
      }
    }
    VVar3 = ReturnTrue;
  }
  ~QMakeEvaluator(&local_2e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFileInto(
        const QString &fileName, ProValueMap *values, LoadFlags flags)
{
    QMakeEvaluator visitor(m_option, m_parser, m_vfs, m_handler);
    visitor.m_caller = this;
    visitor.m_outputDir = m_outputDir;
    visitor.m_featureRoots = m_featureRoots;
    VisitReturn ret = visitor.evaluateFileChecked(fileName, QMakeHandler::EvalAuxFile, flags);
    if (ret != ReturnTrue)
        return ret;
    *values = visitor.m_valuemapStack.top();
    ProKey qiif("QMAKE_INTERNAL_INCLUDED_FILES");
    ProStringList &iif = m_valuemapStack.front()[qiif];
    const auto ifns = values->value(qiif);
    for (const ProString &ifn : ifns)
        if (!iif.contains(ifn))
            iif << ifn;
    return ReturnTrue;
}